

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O1

int __thiscall
soplex::
ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
::number(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
         *this,DLPSV *item)

{
  undefined8 *puVar1;
  ulong uVar2;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  uVar2 = (long)item - (long)this->theitem;
  if ((-1 < (long)uVar2) && ((long)((uVar2 >> 3) * -0x3333333333333333) < (long)this->thesize)) {
    return *(int *)((long)this->theitem + uVar2 + 0x20);
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Invalid index","");
  *puVar1 = &PTR__SPxException_006a9ee8;
  puVar1[1] = puVar1 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 1),local_40,local_40 + local_38);
  __cxa_throw(puVar1,&SPxException::typeinfo,SPxException::~SPxException);
}

Assistant:

int number(const T* item) const
   {
      ptrdiff_t idx = reinterpret_cast<const struct Item*>(item) - theitem;

      if(idx < 0 || idx >= size())
         throw SPxException("Invalid index");

      return theitem[idx].info;
   }